

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

uint lodepng::insertChunks
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *png,
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *chunks)

{
  pointer puVar1;
  bool bVar2;
  uchar *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  int iVar4;
  size_t sVar5;
  uchar *puVar6;
  pointer pvVar7;
  uchar *chunk;
  long lVar8;
  ulong uVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  char type [5];
  uchar *local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  uchar *local_60;
  uchar *local_58;
  char local_4d [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  pointer local_40;
  pointer local_38;
  
  local_38 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  chunk = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start + 8;
  local_58 = (uchar *)0x0;
  local_60 = (uchar *)0x0;
  local_90 = (uchar *)0x0;
  local_48 = png;
  local_40 = chunk;
  do {
    puVar1 = local_40;
    this = local_48;
    if ((local_38 <= chunk + 8) || (chunk < local_40)) {
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar1 = (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,0,puVar1,
                 local_90 + (long)puVar1);
      pvVar7 = (chunks->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((chunks->
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
        lVar8 = 8;
        uVar9 = 0;
        do {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                     local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)((long)pvVar7 + lVar8 + -8),
                     *(undefined8 *)
                      ((long)&(pvVar7->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar8));
          uVar9 = uVar9 + 1;
          pvVar7 = (chunks->
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x18;
        } while (uVar9 < (ulong)(((long)(chunks->
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7
                                 >> 3) * -0x5555555555555555));
      }
      puVar1 = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                 local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_90 + (long)puVar1,local_60 + (long)puVar1);
      pvVar7 = chunks[1].
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (chunks[1].
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
        lVar8 = 8;
        uVar9 = 0;
        do {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                     local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)((long)pvVar7 + lVar8 + -8),
                     *(undefined8 *)
                      ((long)&(pvVar7->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar8));
          uVar9 = uVar9 + 1;
          pvVar7 = chunks[1].
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x18;
        } while (uVar9 < (ulong)(((long)chunks[1].
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >>
                                 3) * -0x5555555555555555));
      }
      puVar1 = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                 local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_60 + (long)puVar1,local_58 + (long)puVar1);
      pvVar7 = chunks[2].
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (chunks[2].
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
        lVar8 = 8;
        uVar9 = 0;
        do {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                     local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)((long)pvVar7 + lVar8 + -8),
                     *(undefined8 *)
                      ((long)&(pvVar7->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar8));
          uVar9 = uVar9 + 1;
          pvVar7 = chunks[2].
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x18;
        } while (uVar9 < (ulong)(((long)chunks[2].
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >>
                                 3) * -0x5555555555555555));
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                 local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_58 +
                 (long)(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start,
                 (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this,&local_88);
      if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return 0;
    }
    lodepng_chunk_type(local_4d,chunk);
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar5 = strlen(local_4d);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,local_4d,local_4d + sVar5);
    if ((local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish == (pointer)0x4) &&
       (puVar6 = lodepng_chunk_next_const(chunk), chunk < puVar6)) {
      iVar4 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar4 == 0) {
        if (local_90 == (uchar *)0x0) {
          local_90 = chunk + (8 - (long)puVar1);
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_88);
        puVar3 = local_58;
        if (iVar4 == 0) {
          if (local_90 == (uchar *)0x0) {
            local_90 = chunk + (8 - (long)puVar1);
          }
          if (local_60 == (uchar *)0x0) {
            local_60 = chunk + (8 - (long)puVar1);
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_88);
          if ((iVar4 == 0) && (puVar3 == (uchar *)0x0)) {
            local_58 = chunk + (8 - (long)puVar1);
          }
        }
      }
      bVar2 = true;
      chunk = puVar6;
    }
    else {
      bVar2 = false;
    }
    if ((pointer *)
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)(local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
    }
  } while (bVar2);
  return 1;
}

Assistant:

unsigned insertChunks(std::vector<unsigned char>& png,
                      const std::vector<std::vector<unsigned char> > chunks[3]) {
  const unsigned char *chunk, *next, *begin, *end;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  long l0 = 0; //location 0: IHDR-l0-PLTE (or IHDR-l0-l1-IDAT)
  long l1 = 0; //location 1: PLTE-l1-IDAT (or IHDR-l0-l1-IDAT)
  long l2 = 0; //location 2: IDAT-l2-IEND

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    std::string name(type);
    if(name.size() != 4) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow

    if(name == "PLTE") {
      if(l0 == 0) l0 = chunk - begin + 8;
    } else if(name == "IDAT") {
      if(l0 == 0) l0 = chunk - begin + 8;
      if(l1 == 0) l1 = chunk - begin + 8;
    } else if(name == "IEND") {
      if(l2 == 0) l2 = chunk - begin + 8;
    }

    chunk = next;
  }

  std::vector<unsigned char> result;
  result.insert(result.end(), png.begin(), png.begin() + l0);
  for(size_t i = 0; i < chunks[0].size(); i++) result.insert(result.end(), chunks[0][i].begin(), chunks[0][i].end());
  result.insert(result.end(), png.begin() + l0, png.begin() + l1);
  for(size_t i = 0; i < chunks[1].size(); i++) result.insert(result.end(), chunks[1][i].begin(), chunks[1][i].end());
  result.insert(result.end(), png.begin() + l1, png.begin() + l2);
  for(size_t i = 0; i < chunks[2].size(); i++) result.insert(result.end(), chunks[2][i].begin(), chunks[2][i].end());
  result.insert(result.end(), png.begin() + l2, png.end());

  png = result;
  return 0;
}